

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

int __thiscall
QDirSortItemComparator::compareStrings
          (QDirSortItemComparator *this,QString *a,QString *b,CaseSensitivity cs)

{
  int iVar1;
  
  if (this->collator != (QCollator *)0x0) {
    iVar1 = QCollator::compare(this->collator,a,b);
    return iVar1;
  }
  iVar1 = QString::compare(a,b,cs);
  return iVar1;
}

Assistant:

int compareStrings(const QString &a, const QString &b, Qt::CaseSensitivity cs) const
    {
#ifndef QT_BOOTSTRAPPED
        if (collator)
            return collator->compare(a, b);
#endif
        return a.compare(b, cs);
    }